

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O3

void __thiscall
QHttpNetworkConnectionPrivate::fillPipeline(QHttpNetworkConnectionPrivate *this,QIODevice *socket)

{
  qsizetype qVar1;
  ulong uVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  Operation OVar6;
  SocketState SVar7;
  QHttpNetworkConnectionChannel *pQVar8;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 getState;
  QString local_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->highPriorityQueue).d.size != 0) || ((this->lowPriorityQueue).d.size != 0)) {
    iVar5 = indexOf(this,socket);
    pQVar8 = this->channels;
    if ((pQVar8[iVar5].reply != (QHttpNetworkReply *)0x0) &&
       (((ulong)pQVar8[iVar5].alreadyPipelinedRequests.d.size < 2 &&
        (pQVar8[iVar5].pipeliningSupported == PipeliningProbablySupported)))) {
      bVar4 = QHttpNetworkRequest::isPipeliningAllowed(&pQVar8[iVar5].request);
      if (bVar4) {
        OVar6 = QHttpNetworkRequest::operation(&this->channels[iVar5].request);
        if (OVar6 == Get) {
          local_48.d.d._0_1_ = (anon_class_1_0_00000001)0xaa;
          SVar7 = QSocketAbstraction::
                  visit<QSocketAbstraction::socketState(QIODevice*)::_lambda(auto:1*)_1_&>
                            ((anon_class_1_0_00000001 *)&local_48,socket);
          if ((SVar7 == ConnectedState) && (this->channels[iVar5].resendCurrent == false)) {
            bVar4 = QAuthenticator::isNull(&this->channels[iVar5].authenticator);
            if (!bVar4) {
              QAuthenticator::user(&local_48,&this->channels[iVar5].authenticator);
              bVar4 = true;
              if (local_48.d.size == 0) {
                QAuthenticator::password(&local_60,&this->channels[iVar5].authenticator);
                bVar4 = local_60.d.size != 0;
                if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              piVar3 = (int *)CONCAT71(local_48.d.d._1_7_,local_48.d.d._0_1_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)CONCAT71(local_48.d.d._1_7_,local_48.d.d._0_1_),2,0x10);
                }
              }
              if (bVar4) goto LAB_002018dc;
            }
            bVar4 = QAuthenticator::isNull(&this->channels[iVar5].proxyAuthenticator);
            if (!bVar4) {
              QAuthenticator::user(&local_48,&this->channels[iVar5].proxyAuthenticator);
              bVar4 = true;
              if (local_48.d.size == 0) {
                QAuthenticator::password(&local_60,&this->channels[iVar5].proxyAuthenticator);
                bVar4 = local_60.d.size != 0;
                if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              piVar3 = (int *)CONCAT71(local_48.d.d._1_7_,local_48.d.d._0_1_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)CONCAT71(local_48.d.d._1_7_,local_48.d.d._0_1_),2,0x10);
                }
              }
              if (bVar4) goto LAB_002018dc;
            }
            pQVar8 = this->channels;
            if ((pQVar8[iVar5].state == ReadingState) || (pQVar8[iVar5].state == WaitingState)) {
              do {
                if ((this->highPriorityQueue).d.size == 0) break;
                qVar1 = pQVar8[iVar5].alreadyPipelinedRequests.d.size;
                fillPipeline(this,&this->highPriorityQueue,pQVar8 + iVar5);
                pQVar8 = this->channels;
                uVar2 = pQVar8[iVar5].alreadyPipelinedRequests.d.size;
                if (2 < uVar2) goto LAB_002018d1;
              } while ((long)(int)qVar1 != uVar2);
              while ((this->lowPriorityQueue).d.size != 0) {
                qVar1 = pQVar8[iVar5].alreadyPipelinedRequests.d.size;
                fillPipeline(this,&this->lowPriorityQueue,pQVar8 + iVar5);
                pQVar8 = this->channels;
                uVar2 = pQVar8[iVar5].alreadyPipelinedRequests.d.size;
                if ((2 < uVar2) || ((long)(int)qVar1 == uVar2)) break;
              }
LAB_002018d1:
              QHttpNetworkConnectionChannel::pipelineFlush
                        ((QHttpNetworkConnectionChannel *)(pQVar8 + iVar5));
            }
          }
        }
      }
    }
  }
LAB_002018dc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionPrivate::fillPipeline(QIODevice *socket)
{
    // return fast if there is nothing to pipeline
    if (highPriorityQueue.isEmpty() && lowPriorityQueue.isEmpty())
        return;

    int i = indexOf(socket);

    // return fast if there was no reply right now processed
    if (channels[i].reply == nullptr)
        return;

    if (! (defaultPipelineLength - channels[i].alreadyPipelinedRequests.size() >= defaultRePipelineLength)) {
        return;
    }

    if (channels[i].pipeliningSupported != QHttpNetworkConnectionChannel::PipeliningProbablySupported)
        return;

    // the current request that is in must already support pipelining
    if (!channels[i].request.isPipeliningAllowed())
        return;

    // the current request must be a idempotent (right now we only check GET)
    if (channels[i].request.operation() != QHttpNetworkRequest::Get)
        return;

    // check if socket is connected
    if (QSocketAbstraction::socketState(socket) != QAbstractSocket::ConnectedState)
        return;

    // check for resendCurrent
    if (channels[i].resendCurrent)
        return;

    // we do not like authentication stuff
    // ### make sure to be OK with this in later releases
    if (!channels[i].authenticator.isNull()
        && (!channels[i].authenticator.user().isEmpty()
            || !channels[i].authenticator.password().isEmpty()))
        return;
    if (!channels[i].proxyAuthenticator.isNull()
        && (!channels[i].proxyAuthenticator.user().isEmpty()
            || !channels[i].proxyAuthenticator.password().isEmpty()))
        return;

    // must be in ReadingState or WaitingState
    if (! (channels[i].state == QHttpNetworkConnectionChannel::WaitingState
           || channels[i].state == QHttpNetworkConnectionChannel::ReadingState))
        return;

    int lengthBefore;
    while (!highPriorityQueue.isEmpty()) {
        lengthBefore = channels[i].alreadyPipelinedRequests.size();
        fillPipeline(highPriorityQueue, channels[i]);

        if (channels[i].alreadyPipelinedRequests.size() >= defaultPipelineLength) {
            channels[i].pipelineFlush();
            return;
        }

        if (lengthBefore == channels[i].alreadyPipelinedRequests.size())
            break; // did not process anything, now do the low prio queue
    }

    while (!lowPriorityQueue.isEmpty()) {
        lengthBefore = channels[i].alreadyPipelinedRequests.size();
        fillPipeline(lowPriorityQueue, channels[i]);

        if (channels[i].alreadyPipelinedRequests.size() >= defaultPipelineLength) {
            channels[i].pipelineFlush();
            return;
        }

        if (lengthBefore == channels[i].alreadyPipelinedRequests.size())
            break; // did not process anything
    }


    channels[i].pipelineFlush();
}